

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzgnames.cpp
# Opt level: O1

int32_t __thiscall
icu_63::TZGNCore::findBestMatch
          (TZGNCore *this,UnicodeString *text,int32_t start,uint32_t types,UnicodeString *tzID,
          UTimeZoneFormatTimeType *timeType,UErrorCode *status)

{
  short sVar1;
  UVector *this_00;
  bool bVar2;
  bool bVar3;
  UBool UVar4;
  uint uVar5;
  int iVar6;
  int32_t iVar7;
  UTimeZoneNameType UVar8;
  undefined4 extraout_var;
  UMemory *this_02;
  void *pvVar9;
  int32_t i_1;
  uint uVar10;
  int32_t i;
  int iVar11;
  UnicodeString bestMatchTzID;
  UnicodeString mzID;
  UTimeZoneFormatTimeType local_e4;
  UnicodeString local_b0;
  UnicodeString local_70;
  MatchInfoCollection *this_01;
  
  *timeType = UTZFMT_TIME_TYPE_UNKNOWN;
  UnicodeString::setToBogus(tzID);
  if (U_ZERO_ERROR < *status) {
    return 0;
  }
  if (types == 0) {
    this_01 = (MatchInfoCollection *)0x0;
  }
  else {
    uVar5 = (int)(types << 0x1e) >> 0x1f & 3;
    uVar10 = uVar5 + 0x18;
    if ((types & 4) == 0) {
      uVar10 = uVar5;
    }
    iVar6 = (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[0xf])
                      (this->fTimeZoneNames,text,(ulong)(uint)start,(ulong)uVar10,status);
    this_01 = (MatchInfoCollection *)CONCAT44(extraout_var,iVar6);
  }
  if (U_ZERO_ERROR < *status) {
    return 0;
  }
  local_b0.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003c0258;
  local_b0.fUnion.fStackFields.fLengthAndFlags = 2;
  if (this_01 == (MatchInfoCollection *)0x0) {
    local_e4 = UTZFMT_TIME_TYPE_UNKNOWN;
    iVar6 = 0;
  }
  else {
    local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003c0258;
    local_70.fUnion.fStackFields.fLengthAndFlags = 2;
    bVar3 = false;
    iVar11 = 0;
    local_e4 = UTZFMT_TIME_TYPE_UNKNOWN;
    iVar6 = 0;
    do {
      iVar7 = TimeZoneNames::MatchInfoCollection::size(this_01);
      if (iVar7 <= iVar11) break;
      iVar7 = TimeZoneNames::MatchInfoCollection::getMatchLengthAt(this_01,iVar11);
      bVar2 = true;
      if (iVar6 < iVar7) {
        UVar4 = TimeZoneNames::MatchInfoCollection::getTimeZoneIDAt(this_01,iVar11,&local_b0);
        if ((UVar4 == '\0') &&
           (UVar4 = TimeZoneNames::MatchInfoCollection::getMetaZoneIDAt(this_01,iVar11,&local_70),
           UVar4 != '\0')) {
          (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[8])
                    (this->fTimeZoneNames,&local_70,this->fTargetRegion,&local_b0);
        }
        UVar8 = TimeZoneNames::MatchInfoCollection::getNameTypeAt(this_01,iVar11);
        bVar2 = *status < U_ILLEGAL_ARGUMENT_ERROR;
        iVar6 = iVar7;
        if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
          if ((int)UVar8 < 0x10) {
            if (UVar8 == UTZNM_LONG_STANDARD) {
LAB_002025d1:
              local_e4 = UTZFMT_TIME_TYPE_STANDARD;
              bVar3 = true;
            }
            else {
              if (UVar8 != UTZNM_LONG_DAYLIGHT) goto LAB_002025a0;
LAB_002025c7:
              local_e4 = UTZFMT_TIME_TYPE_DAYLIGHT;
            }
          }
          else {
            if (UVar8 == UTZNM_SHORT_STANDARD) goto LAB_002025d1;
            if (UVar8 == UTZNM_SHORT_DAYLIGHT) goto LAB_002025c7;
LAB_002025a0:
            local_e4 = UTZFMT_TIME_TYPE_UNKNOWN;
          }
        }
      }
      iVar11 = iVar11 + 1;
    } while (bVar2);
    (*this_01->_vptr_MatchInfoCollection[1])(this_01);
    bVar2 = false;
    iVar7 = 0;
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar11 = (text->fUnion).fFields.fLength;
      }
      else {
        iVar11 = (int)sVar1 >> 5;
      }
      if (bVar3 || iVar6 != iVar11 - start) {
        bVar2 = true;
      }
      else {
        UnicodeString::copyFrom(tzID,&local_b0,'\0');
        *timeType = local_e4;
        bVar2 = false;
        iVar7 = iVar6;
      }
    }
    UnicodeString::~UnicodeString(&local_70);
    if (!bVar2) goto LAB_0020274d;
  }
  this_02 = (UMemory *)findLocal(this,text,start,types,status);
  iVar7 = 0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar7 = iVar6;
    if (this_02 != (UMemory *)0x0) {
      uVar10 = 0;
      while( true ) {
        this_00 = *(UVector **)this_02;
        iVar7 = 0;
        if (this_00 != (UVector *)0x0) {
          iVar7 = this_00->count;
        }
        if (iVar7 <= (int)uVar10) break;
        text = (UnicodeString *)(ulong)uVar10;
        pvVar9 = UVector::elementAt(this_00,uVar10);
        if (pvVar9 == (void *)0x0) {
          iVar11 = -1;
        }
        else {
          iVar11 = *(int *)((long)pvVar9 + 8);
        }
        if (iVar6 <= iVar11) {
          pvVar9 = UVector::elementAt(*(UVector **)this_02,uVar10);
          if (pvVar9 == (void *)0x0) {
            iVar6 = -1;
          }
          else {
            iVar6 = *(int *)((long)pvVar9 + 8);
          }
          local_e4 = UTZFMT_TIME_TYPE_UNKNOWN;
          text = (UnicodeString *)(ulong)uVar10;
          TimeZoneGenericNameMatchInfo::getTimeZoneID
                    ((TimeZoneGenericNameMatchInfo *)this_02,uVar10,&local_b0);
        }
        uVar10 = uVar10 + 1;
      }
      if (this_00 != (UVector *)0x0) {
        (*(this_00->super_UObject)._vptr_UObject[1])();
      }
      UMemory::operator_delete(this_02,text);
      iVar7 = iVar6;
    }
    if (0 < iVar7) {
      *timeType = local_e4;
      UnicodeString::copyFrom(tzID,&local_b0,'\0');
    }
  }
LAB_0020274d:
  UnicodeString::~UnicodeString(&local_b0);
  return iVar7;
}

Assistant:

int32_t
TZGNCore::findBestMatch(const UnicodeString& text, int32_t start, uint32_t types,
        UnicodeString& tzID, UTimeZoneFormatTimeType& timeType, UErrorCode& status) const {
    timeType = UTZFMT_TIME_TYPE_UNKNOWN;
    tzID.setToBogus();

    if (U_FAILURE(status)) {
        return 0;
    }

    // Find matches in the TimeZoneNames first
    TimeZoneNames::MatchInfoCollection *tznamesMatches = findTimeZoneNames(text, start, types, status);
    if (U_FAILURE(status)) {
        return 0;
    }

    int32_t bestMatchLen = 0;
    UTimeZoneFormatTimeType bestMatchTimeType = UTZFMT_TIME_TYPE_UNKNOWN;
    UnicodeString bestMatchTzID;
    // UBool isLongStandard = FALSE;   // workaround - see the comments below
    UBool isStandard = FALSE;       // TODO: Temporary hack (on hack) for short standard name/location name conflict (found in zh_Hant), should be removed after CLDR 21m1 integration

    if (tznamesMatches != NULL) {
        UnicodeString mzID;
        for (int32_t i = 0; i < tznamesMatches->size(); i++) {
            int32_t len = tznamesMatches->getMatchLengthAt(i);
            if (len > bestMatchLen) {
                bestMatchLen = len;
                if (!tznamesMatches->getTimeZoneIDAt(i, bestMatchTzID)) {
                    // name for a meta zone
                    if (tznamesMatches->getMetaZoneIDAt(i, mzID)) {
                        fTimeZoneNames->getReferenceZoneID(mzID, fTargetRegion, bestMatchTzID);
                    }
                }
                UTimeZoneNameType nameType = tznamesMatches->getNameTypeAt(i);
                if (U_FAILURE(status)) {
                    break;
                }
                switch (nameType) {
                case UTZNM_LONG_STANDARD:
                    // isLongStandard = TRUE;
                case UTZNM_SHORT_STANDARD:  // this one is never used for generic, but just in case
                    isStandard = TRUE;      // TODO: Remove this later, see the comments above.
                    bestMatchTimeType = UTZFMT_TIME_TYPE_STANDARD;
                    break;
                case UTZNM_LONG_DAYLIGHT:
                case UTZNM_SHORT_DAYLIGHT: // this one is never used for generic, but just in case
                    bestMatchTimeType = UTZFMT_TIME_TYPE_DAYLIGHT;
                    break;
                default:
                    bestMatchTimeType = UTZFMT_TIME_TYPE_UNKNOWN;
                }
            }
        }
        delete tznamesMatches;
        if (U_FAILURE(status)) {
            return 0;
        }

        if (bestMatchLen == (text.length() - start)) {
            // Full match

            //tzID.setTo(bestMatchTzID);
            //timeType = bestMatchTimeType;
            //return bestMatchLen;

            // TODO Some time zone uses a same name for the long standard name
            // and the location name. When the match is a long standard name,
            // then we need to check if the name is same with the location name.
            // This is probably a data error or a design bug.
/*
            if (!isLongStandard) {
                tzID.setTo(bestMatchTzID);
                timeType = bestMatchTimeType;
                return bestMatchLen;
            }
*/
            // TODO The deprecation of commonlyUsed flag introduced the name
            // conflict not only for long standard names, but short standard names too.
            // These short names (found in zh_Hant) should be gone once we clean
            // up CLDR time zone display name data. Once the short name conflict
            // problem (with location name) is resolved, we should change the condition
            // below back to the original one above. -Yoshito (2011-09-14)
            if (!isStandard) {
                tzID.setTo(bestMatchTzID);
                timeType = bestMatchTimeType;
                return bestMatchLen;
            }
        }
    }

    // Find matches in the local trie
    TimeZoneGenericNameMatchInfo *localMatches = findLocal(text, start, types, status);
    if (U_FAILURE(status)) {
        return 0;
    }
    if (localMatches != NULL) {
        for (int32_t i = 0; i < localMatches->size(); i++) {
            int32_t len = localMatches->getMatchLength(i);

            // TODO See the above TODO. We use len >= bestMatchLen
            // because of the long standard/location name collision
            // problem. If it is also a location name, carrying
            // timeType = UTZFMT_TIME_TYPE_STANDARD will cause a
            // problem in SimpleDateFormat
            if (len >= bestMatchLen) {
                bestMatchLen = localMatches->getMatchLength(i);
                bestMatchTimeType = UTZFMT_TIME_TYPE_UNKNOWN;   // because generic
                localMatches->getTimeZoneID(i, bestMatchTzID);
            }
        }
        delete localMatches;
    }

    if (bestMatchLen > 0) {
        timeType = bestMatchTimeType;
        tzID.setTo(bestMatchTzID);
    }
    return bestMatchLen;
}